

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_2,_3> * __thiscall
gl4cts::Math::transpose<double,3,2>
          (Matrix<double,_2,_3> *__return_storage_ptr__,Math *this,Matrix<double,_3,_2> *matrix)

{
  Matrix<double,_2,_3> *pMVar1;
  int row;
  long lVar2;
  long lVar3;
  double *pdVar4;
  Math *pMVar5;
  Matrix<double,_2,_3> *result;
  int col;
  long lVar6;
  bool bVar7;
  uint uVar8;
  
  pMVar1 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  pdVar4 = (double *)__return_storage_ptr__;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3ff00000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(ulong *)((long)pdVar4 + lVar6) = (ulong)uVar8 << 0x20;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    pdVar4 = pdVar4 + 1;
    lVar2 = lVar2 + 0x10;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  lVar3 = 0;
  do {
    lVar2 = 0;
    pMVar5 = this;
    do {
      ((Vector<tcu::Vector<double,_2>,_3> *)((Vector<double,_2> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar2] = *(double *)pMVar5;
      lVar2 = lVar2 + 1;
      pMVar5 = pMVar5 + 0x18;
    } while (lVar2 == 1);
    lVar3 = lVar3 + 1;
    __return_storage_ptr__ = (Matrix<double,_2,_3> *)((long)__return_storage_ptr__ + 0x10);
    this = this + 8;
  } while (lVar3 != 3);
  return pMVar1;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}